

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

bool __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
should_expand_right(Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    *this)

{
  int iVar1;
  bool bVar2;
  
  if (this->root_node_->is_leaf_ == false) {
    iVar1 = (this->istats_).num_keys_above_key_domain;
    if ((iVar1 < 5) ||
       (bVar2 = true,
       iVar1 < ((this->stats_).num_keys / (this->istats_).num_keys_at_last_right_domain_resize) * 2
               + -2)) {
      return 999 < iVar1;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool should_expand_right() const {
    return (!root_node_->is_leaf_ &&
            ((istats_.num_keys_above_key_domain >= kMinOutOfDomainKeys &&
              istats_.num_keys_above_key_domain >=
                  kOutOfDomainToleranceFactor *
                      (stats_.num_keys /
                           istats_.num_keys_at_last_right_domain_resize -
                       1)) ||
             istats_.num_keys_above_key_domain >= kMaxOutOfDomainKeys));
  }